

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O2

void __thiscall
duckdb::roaring::ContainerCompressionState::Finalize(ContainerCompressionState *this)

{
  uint16_t uVar1;
  ushort uVar2;
  ulong uVar3;
  
  uVar1 = this->appended_count;
  if ((uVar1 != 0) && (this->last_is_null == true)) {
    uVar2 = this->run_idx;
    uVar3 = (ulong)uVar2;
    if (uVar3 < 0x7c) {
      if (uVar2 < 4) {
        this->runs[uVar3].length = uVar1 - this->runs[uVar3].start;
      }
      this->compressed_runs[(ulong)(uVar2 & 0x7fff) * 2 + 1] = (uint8_t)uVar1;
      if (this->appended_count != 0x800) {
        this->run_counts[this->appended_count >> 8] =
             this->run_counts[this->appended_count >> 8] + '\x01';
      }
      this->run_idx = this->run_idx + 1;
    }
  }
  this->finalized = true;
  return;
}

Assistant:

void ContainerCompressionState::Finalize() {
	D_ASSERT(!finalized);
	if (appended_count && last_is_null && run_idx < MAX_RUN_IDX) {
		if (run_idx < COMPRESSED_RUN_THRESHOLD) {
			auto &last_run = runs[run_idx];
			// End the last run
			last_run.length = (appended_count - last_run.start);
		}
		compressed_runs[(run_idx * 2) + 1] = static_cast<uint8_t>(appended_count % COMPRESSED_SEGMENT_SIZE);
		if (appended_count != ROARING_CONTAINER_SIZE) {
			run_counts[appended_count >> COMPRESSED_SEGMENT_SHIFT_AMOUNT]++;
		}
		run_idx++;
	}
	finalized = true;
}